

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diff.c
# Opt level: O2

LY_ERR lyd_diff_reverse_value(lyd_node *node,lys_module *mod)

{
  uint32_t uVar1;
  LY_ERR LVar2;
  lyd_meta *meta;
  lyd_any_value val_str;
  char *pcVar3;
  lys_module *plVar4;
  char *val2;
  lyd_any_value anyval;
  
  if ((node->schema->nodetype & 100) == 0) {
    __assert_fail("node->schema->nodetype & (LYS_LEAF | LYS_ANYDATA)",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/diff.c",
                  0x848,
                  "LY_ERR lyd_diff_reverse_value(struct lyd_node *, const struct lys_module *)");
  }
  meta = lyd_find_meta(node->meta,mod,"orig-value");
  if (meta == (lyd_meta *)0x0) {
    pcVar3 = lyd_path(node,LYD_PATH_STD,(char *)0x0,0);
    if (node->schema == (lysc_node *)0x0) {
      plVar4 = (lys_module *)&node[2].schema;
    }
    else {
      plVar4 = node->schema->module;
    }
    LVar2 = LY_EINVAL;
    ly_log(plVar4->ctx,LY_LLERR,LY_EINVAL,"Failed to find metadata \"%s\" for node \"%s\".",
           "orig-value",pcVar3);
  }
  else {
    val_str.str = lyd_get_meta_value(meta);
    if (node->schema->nodetype == 4) {
      pcVar3 = lyd_get_value(node);
      val2 = strdup(pcVar3);
    }
    else {
      LVar2 = lyd_any_value_str(node,&val2);
      if (LVar2 != LY_SUCCESS) {
        return LVar2;
      }
    }
    uVar1 = node->flags;
    if (node->schema->nodetype == 4) {
      LVar2 = lyd_change_term(node,val_str.str);
    }
    else {
      anyval.tree = val_str.tree;
      LVar2 = lyd_any_copy_value(node,&anyval,LYD_ANYDATA_STRING);
    }
    pcVar3 = val2;
    if (LVar2 == LY_SUCCESS) {
      node->flags = uVar1;
      LVar2 = lyd_change_meta(meta,val2);
      pcVar3 = val2;
    }
  }
  free(pcVar3);
  return LVar2;
}

Assistant:

static LY_ERR
lyd_diff_reverse_value(struct lyd_node *node, const struct lys_module *mod)
{
    LY_ERR ret = LY_SUCCESS;
    struct lyd_meta *meta;
    const char *val1 = NULL;
    char *val2;
    uint32_t flags;

    assert(node->schema->nodetype & (LYS_LEAF | LYS_ANYDATA));

    meta = lyd_find_meta(node->meta, mod, "orig-value");
    LY_CHECK_ERR_RET(!meta, LOGERR_META(LYD_CTX(node), "orig-value", node), LY_EINVAL);

    /* orig-value */
    val1 = lyd_get_meta_value(meta);

    /* current value */
    if (node->schema->nodetype == LYS_LEAF) {
        val2 = strdup(lyd_get_value(node));
    } else {
        LY_CHECK_RET(lyd_any_value_str(node, &val2));
    }

    /* switch values, keep default flag */
    flags = node->flags;
    if (node->schema->nodetype == LYS_LEAF) {
        LY_CHECK_GOTO(ret = lyd_change_term(node, val1), cleanup);
    } else {
        union lyd_any_value anyval = {.str = val1};

        LY_CHECK_GOTO(ret = lyd_any_copy_value(node, &anyval, LYD_ANYDATA_STRING), cleanup);
    }
    node->flags = flags;
    LY_CHECK_GOTO(ret = lyd_change_meta(meta, val2), cleanup);

cleanup:
    free(val2);
    return ret;
}